

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

int Imf_3_4::anon_unknown_8::levelSize(int min,int max,int l,LevelRoundingMode levelRoundingMode)

{
  int *piVar1;
  int in_ECX;
  byte in_DL;
  int in_ESI;
  int in_EDI;
  int size;
  int b;
  int a;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_4;
  
  if (in_ESI < in_EDI) {
    local_4 = 0;
  }
  else {
    local_18 = (in_ESI - in_EDI) + 1;
    local_1c = 1 << (in_DL & 0x1f);
    local_20 = local_18 / local_1c;
    if ((in_ECX == 1) && (local_20 * local_1c < local_18)) {
      local_20 = local_20 + 1;
    }
    local_24 = 1;
    piVar1 = std::max<int>(&local_20,&local_24);
    local_4 = *piVar1;
  }
  return local_4;
}

Assistant:

int
levelSize (int min, int max, int l, LevelRoundingMode levelRoundingMode)
{
    assert (l >= 0);

    if (max < min) return 0;

    int a    = max - min + 1;
    int b    = (1 << l);
    int size = a / b;

    if (levelRoundingMode == ROUND_UP && size * b < a) size += 1;

    return std::max (size, 1);
}